

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer.hpp
# Opt level: O3

void __thiscall Optimizer::optimize(Optimizer *this,ScheduleHandle *origin,string *output_path)

{
  _Rb_tree_header *p_Var1;
  ulong uVar2;
  _Alloc_hider _Var3;
  Optimizer *pOVar4;
  string *path;
  pointer psVar5;
  _Base_ptr p_Var6;
  bool bVar7;
  size_t sVar8;
  long lVar9;
  _Base_ptr p_Var10;
  element_type *this_00;
  char *pcVar11;
  _Base_ptr p_Var12;
  _Base_ptr p_Var13;
  shared_ptr<Schedule> *substitution;
  pointer s2;
  uint uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  pair<unsigned_long,_unsigned_long> pVar17;
  ScheduleHandle best;
  value_type top;
  Comparator comparator;
  vector<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_> substitutions;
  priority_queue<std::shared_ptr<Schedule>,_std::vector<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>,_Comparator>
  queue;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> hash_set;
  string local_138;
  uint local_10c;
  ScheduleHandle local_108;
  ScheduleHandle local_f8;
  Optimizer *local_e8;
  string *local_e0;
  long local_d8;
  Comparator local_d0;
  vector<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_> local_c0;
  priority_queue<std::shared_ptr<Schedule>,_std::vector<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>,_Comparator>
  local_a8;
  string local_80;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  local_60;
  
  local_108.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (origin->super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_108.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (origin->super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  this_00 = local_108.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (local_108.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_108.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_108.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi)->_M_use_count + 1;
      UNLOCK();
      this_00 = (origin->super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    }
    else {
      (local_108.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_108.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi)->_M_use_count + 1;
    }
  }
  pVar17 = Schedule::analyze(this_00);
  local_d0.origin_time = pVar17.second;
  local_d0.limit = this->limit;
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_138.field_2._M_allocated_capacity = 0;
  local_138._M_dataplus._M_p = (pointer)0x0;
  local_138._M_string_length = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  std::
  priority_queue<std::shared_ptr<Schedule>,_std::vector<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>,_Comparator>
  ::priority_queue(&local_a8,&local_d0,
                   (vector<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_> *
                   )&local_138);
  std::vector<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>::~vector
            ((vector<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_> *)
             &local_138);
  std::
  priority_queue<std::shared_ptr<Schedule>,_std::vector<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>,_Comparator>
  ::push(&local_a8,origin);
  local_138._M_dataplus._M_p =
       (pointer)Schedule::hash((origin->super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>).
                               _M_ptr);
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::_M_insert_unique<unsigned_long>(&local_60,(unsigned_long *)&local_138);
  Schedule::info_abi_cxx11_
            (&local_138,(origin->super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  local_e8 = this;
  local_e0 = output_path;
  printf(" > Start back-tracing search from source (%s)\n",local_138._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  local_d8 = std::chrono::_V2::system_clock::now();
  uVar14 = 0;
  do {
    if (local_a8.c.
        super__Vector_base<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        local_a8.c.
        super__Vector_base<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>.
        _M_impl.super__Vector_impl_data._M_finish) break;
    local_f8.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         ((local_a8.c.
           super__Vector_base<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->
         super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_f8.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         ((local_a8.c.
           super__Vector_base<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->
         super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    if (local_f8.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_f8.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_f8.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_f8.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_f8.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    std::
    priority_queue<std::shared_ptr<Schedule>,_std::vector<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>,_Comparator>
    ::pop(&local_a8);
    bVar7 = Comparator::considerable(&local_d0,&local_108,&local_f8);
    if (bVar7) {
      generateSubstitutions(&local_c0,&local_f8);
      psVar5 = local_c0.
               super__Vector_base<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (s2 = local_c0.
                super__Vector_base<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>
                ._M_impl.super__Vector_impl_data._M_start; s2 != psVar5; s2 = s2 + 1) {
        sVar8 = Schedule::hash((s2->super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                              );
        p_Var6 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var13 = &p_Var1->_M_header;
        if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
LAB_001197e4:
          bVar7 = Comparator::considerable(&local_d0,&local_108,s2);
          if (bVar7) {
            std::
            priority_queue<std::shared_ptr<Schedule>,_std::vector<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>,_Comparator>
            ::push(&local_a8,s2);
            local_138._M_dataplus._M_p =
                 (pointer)Schedule::hash((s2->
                                         super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>).
                                         _M_ptr);
            std::
            _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
            ::_M_insert_unique<unsigned_long>(&local_60,(unsigned_long *)&local_138);
          }
          bVar7 = Comparator::operator()(&local_d0,&local_108,s2);
          if (bVar7) {
            local_108.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (s2->super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                      (&local_108.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,
                       &(s2->super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
          }
        }
        else {
          do {
            p_Var12 = p_Var13;
            p_Var10 = p_Var6;
            uVar2 = *(ulong *)(p_Var10 + 1);
            p_Var13 = p_Var10;
            if (uVar2 < sVar8) {
              p_Var13 = p_Var12;
            }
            p_Var6 = (&p_Var10->_M_left)[uVar2 < sVar8];
          } while ((&p_Var10->_M_left)[uVar2 < sVar8] != (_Base_ptr)0x0);
          if ((_Rb_tree_header *)p_Var13 == p_Var1) goto LAB_001197e4;
          if (uVar2 < sVar8) {
            p_Var10 = p_Var12;
          }
          if (sVar8 < *(ulong *)(p_Var10 + 1)) goto LAB_001197e4;
        }
      }
      pVar17 = Schedule::analyze(local_108.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr);
      uVar14 = uVar14 + 1;
      if ((local_d0.limit < pVar17.first) ||
         (auVar15._8_4_ = pVar17.second._4_4_, auVar15._0_8_ = pVar17.second,
         auVar15._12_4_ = 0x45300000, auVar16._8_4_ = (int)(local_d0.origin_time >> 0x20),
         auVar16._0_8_ = local_d0.origin_time, auVar16._12_4_ = 0x45300000,
         ((auVar16._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)local_d0.origin_time) - 4503599627370496.0)) * 1.01 <
         (auVar15._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)pVar17.second) - 4503599627370496.0))) {
        if (uVar14 == 0x5dc) {
          pcVar11 = " > Reach search limit, stop searching";
          goto LAB_001198f7;
        }
        if ((uVar14 * -0x69d0369d + 0x1b4e818 >> 2 | uVar14 * -0x40000000) < 0xda740d) {
          local_10c = uVar14;
          pretty_abi_cxx11_(&local_138,
                            (local_f8.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->peak_memory,0x400,prettyBytes::units,4);
          _Var3._M_p = local_138._M_dataplus._M_p;
          prettyNanoseconds_abi_cxx11_
                    (&local_80,
                     (local_f8.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     total_time);
          printf(" > Progress (%d): %s, %s\n",(ulong)local_10c,_Var3._M_p,local_80._M_dataplus._M_p)
          ;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != &local_138.field_2) {
            operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
          }
          bVar7 = false;
          uVar14 = local_10c;
        }
        else {
          bVar7 = false;
        }
      }
      else {
        pcVar11 = " > Already satisfy requirement, stop searching";
LAB_001198f7:
        puts(pcVar11);
        bVar7 = true;
      }
      std::vector<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>::~vector
                (&local_c0);
    }
    else {
      bVar7 = false;
    }
    if (local_f8.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_f8.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                );
    }
  } while (!bVar7);
  puts(" > Result:");
  printf("   > Schedules searched: %d\n",(ulong)uVar14);
  lVar9 = std::chrono::_V2::system_clock::now();
  prettyNanoseconds_abi_cxx11_(&local_138,lVar9 - local_d8);
  printf("   > Time used: %s\n",local_138._M_dataplus._M_p);
  path = local_e0;
  pOVar4 = local_e8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  Schedule::info_abi_cxx11_
            (&local_138,local_108.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  printf("   > Best: {%s}\n",local_138._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  pcVar11 = "true";
  if (pOVar4->limit <
      (local_108.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->peak_memory) {
    pcVar11 = "false";
  }
  printf("   > Satisfy memory: %s\n",pcVar11);
  printf(" > Writing result into path %s ... ",(path->_M_dataplus)._M_p);
  Schedule::restoreAndDumpToFile
            (local_108.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_ptr,path);
  puts("OK!");
  std::vector<std::shared_ptr<Schedule>,_std::allocator<std::shared_ptr<Schedule>_>_>::~vector
            (&local_a8.c);
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~_Rb_tree(&local_60);
  if (local_108.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_108.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  return;
}

Assistant:

void optimize(const ScheduleHandle &origin, const std::string &output_path) const {
        ScheduleHandle best = origin;
        auto comparator = Comparator{origin->analyze().second, limit};
        std::set<size_t> hash_set;
        std::priority_queue<ScheduleHandle, std::vector<ScheduleHandle>, Comparator> queue(comparator);

        // Source
        queue.push(origin);
        hash_set.insert(origin->hash());

        // Back-tracing search
        printf(" > Start back-tracing search from source (%s)\n", origin->info().c_str());
        Timer timer;
        int count = 0;
        while (not queue.empty()) {
            auto top = queue.top();
            queue.pop();

            if (not comparator.considerable(best, top)) {
                continue;
            }

            ++ count;

            // Substitute
            std::vector<ScheduleHandle> substitutions = generateSubstitutions(top);

            // Insert and check
            for (auto &substitution: substitutions) {
                if (hash_set.count(substitution->hash())) {
                    continue;
                }
                if (comparator.considerable(best, substitution)) {
                    queue.push(substitution);
                    hash_set.insert(substitution->hash());
                }
                if (comparator(best, substitution)) {
                    best = substitution;
                }
            }

            if (comparator.satisfy(best)) {
                printf(" > Already satisfy requirement, stop searching\n");
                break;
            }

            if (count == SEARCH_LIMIT) {
                printf(" > Reach search limit, stop searching\n");
                break;
            }

            if (count % PRINT_FREQUENCY == 0) {
                printf(" > Progress (%d): %s, %s\n", count, prettyBytes(top->peak_memory).c_str(), prettyNanoseconds(top->total_time).c_str());
            }
        }

        // Show best
        printf(" > Result:\n");
        printf("   > Schedules searched: %d\n", count);
        printf("   > Time used: %s\n", prettyNanoseconds(timer.tik()).c_str());
        printf("   > Best: {%s}\n", best->info().c_str());
        printf("   > Satisfy memory: %s\n", best->peak_memory <= limit ? "true" : "false");

        // Write result
        printf(" > Writing result into path %s ... ", output_path.c_str());
        best->restoreAndDumpToFile(output_path);
        printf("OK!\n");
    }